

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uint32_t crc32(void *data,size_t n)

{
  int i;
  uint32_t crcreg;
  uint8_t *bytes;
  size_t n_local;
  void *data_local;
  
  crcreg = 0xffffffff;
  for (i = 0; (ulong)(long)i < n; i = i + 1) {
    crcreg = crcreg >> 8 ^ crc32_table[(crcreg ^ *(byte *)((long)data + (long)i)) & 0xff];
  }
  return crcreg ^ 0xffffffff;
}

Assistant:

uint32_t
crc32(const void* data, size_t n)
{
    const uint8_t* bytes = (const uint8_t*) data;
    uint32_t crcreg = CRC32_INITXOR;
    int i;

    for(i = 0; i < n; i++)
        crcreg = (crcreg >> 8) ^ crc32_table[((crcreg ^ bytes[i]) & 0xffU)];

    return crcreg ^ CRC32_FINALXOR;
}